

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReverseLayerParams::ReverseLayerParams
          (ReverseLayerParams *this,ReverseLayerParams *from)

{
  ReverseLayerParams *from_local;
  ReverseLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReverseLayerParams_006f5558;
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->reversedim_,&from->reversedim_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

ReverseLayerParams::ReverseLayerParams(const ReverseLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      reversedim_(from.reversedim_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReverseLayerParams)
}